

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLElement::ShallowEqual(XMLElement *this,XMLNode *compare)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar3;
  char *pcVar4;
  XMLAttribute *local_38;
  XMLAttribute *b;
  XMLAttribute *a;
  XMLElement *other;
  XMLNode *compare_local;
  XMLElement *this_local;
  XMLElement *this_00;
  
  iVar2 = (*compare->_vptr_XMLNode[6])();
  this_00 = (XMLElement *)CONCAT44(extraout_var,iVar2);
  if (this_00 != (XMLElement *)0x0) {
    pcVar3 = Name(this_00);
    pcVar4 = Name(this);
    bVar1 = XMLUtil::StringEqual(pcVar3,pcVar4,0x7fffffff);
    if (bVar1) {
      b = FirstAttribute(this);
      for (local_38 = FirstAttribute(this_00);
          b != (XMLAttribute *)0x0 && local_38 != (XMLAttribute *)0x0;
          local_38 = XMLAttribute::Next(local_38)) {
        pcVar3 = XMLAttribute::Value(b);
        pcVar4 = XMLAttribute::Value(local_38);
        bVar1 = XMLUtil::StringEqual(pcVar3,pcVar4,0x7fffffff);
        if (!bVar1) {
          return false;
        }
        b = XMLAttribute::Next(b);
      }
      if ((b == (XMLAttribute *)0x0) && (local_38 == (XMLAttribute *)0x0)) {
        return true;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool XMLElement::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLElement* other = compare->ToElement();
    if ( other && XMLUtil::StringEqual( other->Name(), Name() )) {

        const XMLAttribute* a=FirstAttribute();
        const XMLAttribute* b=other->FirstAttribute();

        while ( a && b ) {
            if ( !XMLUtil::StringEqual( a->Value(), b->Value() ) ) {
                return false;
            }
            a = a->Next();
            b = b->Next();
        }
        if ( a || b ) {
            // different count
            return false;
        }
        return true;
    }
    return false;
}